

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

size_t __thiscall helics::Input::getByteCount(Input *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Input *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  data_view dv;
  Input *in_stack_000000a0;
  Input *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 local_8;
  
  isUpdated(in_stack_ffffffffffffffa8);
  helics::ValueFederate::getBytes
            ((ValueFederate *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
  bVar1 = data_view::empty((data_view *)0x365085);
  if (bVar1) {
    this_00 = getValueRef<std::__cxx11::string>(in_stack_000000a0);
    local_8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(this_00);
  }
  else {
    local_8 = data_view::size((data_view *)0x3650e1);
  }
  data_view::~data_view((data_view *)0x3650f8);
  return local_8;
}

Assistant:

size_t Input::getByteCount()
{
    isUpdated();
    auto dv = fed->getBytes(*this);
    if (dv.empty()) {
        const auto& out = getValueRef<std::string>();
        return out.size();
    }
    return dv.size();
}